

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O3

void __thiscall QLabel::setTextFormat(QLabel *this,TextFormat format)

{
  long lVar1;
  QArrayData *pQVar2;
  long in_FS_OFFSET;
  QString local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QFrame).super_QWidget.field_0x8;
  if (*(TextFormat *)(lVar1 + 0x324) != format) {
    *(TextFormat *)(lVar1 + 0x324) = format;
    local_28.d.d = *(Data **)(lVar1 + 0x288);
    local_28.d.ptr = *(char16_t **)(lVar1 + 0x290);
    local_28.d.size = *(qsizetype *)(lVar1 + 0x298);
    if (&(local_28.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (local_28.d.ptr != (char16_t *)0x0) {
      if (*(long *)(lVar1 + 0x290) != 0) {
        pQVar2 = *(QArrayData **)(lVar1 + 0x288);
        *(undefined8 *)(lVar1 + 0x288) = 0;
        *(undefined8 *)(lVar1 + 0x290) = 0;
        *(undefined8 *)(lVar1 + 0x298) = 0;
        if (pQVar2 != (QArrayData *)0x0) {
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar2,2,0x10);
          }
        }
      }
      setText(this,&local_28);
    }
    if (&(local_28.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_28.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLabel::setTextFormat(Qt::TextFormat format)
{
    Q_D(QLabel);
    if (format != d->textformat) {
        d->textformat = format;
        QString t = d->text;
        if (!t.isNull()) {
            d->text.clear();
            setText(t);
        }
    }
}